

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

void __thiscall
TypedImageChannel<Imath_3_2::half>::TypedImageChannel
          (TypedImageChannel<Imath_3_2::half> *this,Image *image,int xSampling,int ySampling)

{
  ArgExc *this_00;
  
  (this->super_ImageChannel)._image = image;
  (this->super_ImageChannel)._vptr_ImageChannel = (_func_int **)&PTR__TypedImageChannel_00108c38;
  this->_xSampling = xSampling;
  this->_ySampling = ySampling;
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D(&this->_pixels,0,0);
  if ((0 < this->_xSampling) && (0 < this->_ySampling)) {
    (*(this->super_ImageChannel)._vptr_ImageChannel[4])(this);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Invalid x/y sampling values");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

TypedImageChannel<T>::TypedImageChannel (
    Image& image, int xSampling, int ySampling)
    : ImageChannel (image)
    , _xSampling (xSampling)
    , _ySampling (ySampling)
    , _pixels (0, 0)
{
    if (_xSampling < 1 || _ySampling < 1)
        throw IEX_NAMESPACE::ArgExc ("Invalid x/y sampling values");
    resize ();
}